

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::threshold(Dictionary *this,int64_t t,int64_t tl)

{
  int iVar1;
  pointer peVar2;
  pointer __s;
  pointer piVar3;
  pointer pcVar4;
  size_type sVar5;
  int32_t iVar6;
  pointer peVar7;
  size_type sVar8;
  uint32_t h;
  long lVar9;
  __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  __i;
  vector<int,_std::allocator<int>_> *pvVar10;
  iterator iVar11;
  pointer peVar12;
  string_view w;
  
  peVar12 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
            _M_impl.super__Vector_impl_data._M_start;
  peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (peVar12 != peVar2) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
              (peVar12,peVar2,
               (int)LZCOUNT(((long)peVar2 - (long)peVar12 >> 3) * -0x71c71c71c71c71c7) * 2 ^ 0x7e);
    if ((long)peVar2 - (long)peVar12 < 0x481) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                (peVar12,peVar2);
    }
    else {
      peVar7 = peVar12 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                (peVar12,peVar7);
      for (; peVar7 != peVar2; peVar7 = peVar7 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,__gnu_cxx::__ops::_Val_comp_iter<fasttext::Dictionary::threshold(long,long)::__0>>
                  (peVar7);
      }
    }
  }
  peVar12 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
            _M_impl.super__Vector_impl_data._M_start;
  peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar9 = ((long)peVar2 - (long)peVar12 >> 3) * -0x71c71c71c71c71c7 >> 2;
  peVar7 = peVar12;
  if (0 < lVar9) {
    peVar7 = peVar12 + lVar9 * 4;
    lVar9 = lVar9 + 1;
    iVar11._M_current = peVar12 + 2;
    do {
      if (iVar11._M_current[-2].type == label) {
        if (iVar11._M_current[-2].count < tl) goto LAB_00126b66;
      }
      else if ((iVar11._M_current[-2].type == word) && (iVar11._M_current[-2].count < t)) {
LAB_00126b66:
        iVar11._M_current = iVar11._M_current + -2;
        goto LAB_00126b79;
      }
      if (iVar11._M_current[-1].type == label) {
        if (iVar11._M_current[-1].count < tl) goto LAB_00126b6f;
      }
      else if ((iVar11._M_current[-1].type == word) && (iVar11._M_current[-1].count < t)) {
LAB_00126b6f:
        iVar11._M_current = iVar11._M_current + -1;
        goto LAB_00126b79;
      }
      if ((iVar11._M_current)->type == label) {
        if ((iVar11._M_current)->count < tl) goto LAB_00126b79;
      }
      else if (((iVar11._M_current)->type == word) && ((iVar11._M_current)->count < t))
      goto LAB_00126b79;
      if (iVar11._M_current[1].type == label) {
        if (iVar11._M_current[1].count < tl) goto LAB_00126b75;
      }
      else if ((iVar11._M_current[1].type == word) && (iVar11._M_current[1].count < t)) {
LAB_00126b75:
        iVar11._M_current = iVar11._M_current + 1;
        goto LAB_00126b79;
      }
      lVar9 = lVar9 + -1;
      iVar11._M_current = iVar11._M_current + 4;
    } while (1 < lVar9);
  }
  lVar9 = ((long)peVar2 - (long)peVar7 >> 3) * -0x71c71c71c71c71c7;
  iVar11._M_current = peVar2;
  if (lVar9 == 1) {
LAB_00126b3b:
    if (peVar7->type == label) {
      if (tl <= peVar7->count) {
        peVar7 = peVar2;
      }
    }
    else if ((peVar7->type != word) || (t <= peVar7->count)) goto LAB_00126b79;
  }
  else if (lVar9 == 2) {
LAB_00126b19:
    if (peVar7->type == label) {
      if (tl <= peVar7->count) goto LAB_00126b37;
    }
    else if ((peVar7->type != word) || (t <= peVar7->count)) {
LAB_00126b37:
      peVar7 = peVar7 + 1;
      goto LAB_00126b3b;
    }
  }
  else {
    if (lVar9 != 3) goto LAB_00126b79;
    if (peVar7->type == label) {
      if (tl <= peVar7->count) {
LAB_00126b15:
        peVar7 = peVar7 + 1;
        goto LAB_00126b19;
      }
    }
    else if ((peVar7->type != word) || (t <= peVar7->count)) goto LAB_00126b15;
  }
  iVar11._M_current = peVar7;
LAB_00126b79:
  if (iVar11._M_current + 1 != peVar2 && iVar11._M_current != peVar2) {
    pvVar10 = &iVar11._M_current[1].subwords;
    do {
      if (*(char *)((long)(pvVar10 + -1) + 0x10) == '\x01') {
        if (tl <= *(long *)((long)(pvVar10 + -1) + 8)) goto LAB_00126bb8;
      }
      else if ((*(char *)((long)(pvVar10 + -1) + 0x10) != '\0') ||
              (t <= *(long *)((long)(pvVar10 + -1) + 8))) {
LAB_00126bb8:
        std::__cxx11::string::operator=((string *)iVar11._M_current,(string *)(pvVar10 + -2));
        (iVar11._M_current)->count = *(int64_t *)((long)(pvVar10 + -1) + 8);
        (iVar11._M_current)->type = *(entry_type *)((long)(pvVar10 + -1) + 0x10);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&(iVar11._M_current)->subwords,pvVar10);
        iVar11._M_current = iVar11._M_current + 1;
      }
      peVar12 = (pointer)(pvVar10 + 1);
      pvVar10 = pvVar10 + 3;
    } while (peVar12 != peVar2);
  }
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::_M_erase
            (&this->words_,iVar11,
             (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  if ((this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>,_true>::
    _S_do_it(&this->words_);
  }
  this->size_ = 0;
  this->nwords_ = 0;
  this->nlabels_ = 0;
  __s = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start;
  piVar3 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != piVar3) {
    memset(__s,0xff,((long)piVar3 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (peVar12 = (this->words_).
                 super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                 super__Vector_impl_data._M_start; peVar12 != peVar2; peVar12 = peVar12 + 1) {
    pcVar4 = (peVar12->word)._M_dataplus._M_p;
    sVar5 = (peVar12->word)._M_string_length;
    h = 0x811c9dc5;
    if (sVar5 != 0) {
      sVar8 = 0;
      do {
        h = ((int)pcVar4[sVar8] ^ h) * 0x1000193;
        sVar8 = sVar8 + 1;
      } while (sVar5 != sVar8);
    }
    w._M_str = pcVar4;
    w._M_len = sVar5;
    iVar6 = find(this,w,h);
    iVar1 = this->size_;
    this->size_ = iVar1 + 1;
    __s[iVar6] = iVar1;
    if (peVar12->type == label) {
      this->nlabels_ = this->nlabels_ + 1;
    }
    else if (peVar12->type == word) {
      this->nwords_ = this->nwords_ + 1;
    }
  }
  return;
}

Assistant:

void Dictionary::threshold(int64_t t, int64_t tl) {
  sort(words_.begin(), words_.end(), [](const entry& e1, const entry& e2) {
    if (e1.type != e2.type) {
      return e1.type < e2.type;
    }
    return e1.count > e2.count;
  });
  words_.erase(
      remove_if(
          words_.begin(),
          words_.end(),
          [&](const entry& e) {
            return (e.type == entry_type::word && e.count < t) ||
                (e.type == entry_type::label && e.count < tl);
          }),
      words_.end());
  words_.shrink_to_fit();
  size_ = 0;
  nwords_ = 0;
  nlabels_ = 0;
  std::fill(word2int_.begin(), word2int_.end(), -1);
  for (auto it = words_.begin(); it != words_.end(); ++it) {
    int32_t h = find(it->word);
    word2int_[h] = size_++;
    if (it->type == entry_type::word) {
      nwords_++;
    }
    if (it->type == entry_type::label) {
      nlabels_++;
    }
  }
}